

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O0

bool __thiscall leveldb::log::Reader::ReadRecord(Reader *this,Slice *record,string *scratch)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  Reader *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  uint64_t physical_record_offset;
  uint record_type;
  uint64_t prospective_record_offset;
  bool in_fragmented_record;
  Slice fragment;
  char buf [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  Slice *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  Reader *in_stack_ffffffffffffff28;
  Reader *in_stack_ffffffffffffff30;
  Reader *in_stack_ffffffffffffff38;
  long local_88;
  undefined7 in_stack_ffffffffffffff80;
  byte bVar6;
  Reader *pRVar7;
  bool local_59;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  char local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(ulong *)(in_RDI + 0x48) <= *(ulong *)(in_RDI + 0x38)) ||
     (bVar1 = SkipToInitialBlock(in_stack_ffffffffffffff38), bVar1)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
              (in_stack_fffffffffffffef8);
    Slice::clear((Slice *)in_stack_fffffffffffffef8);
    bVar6 = 0;
    local_88 = 0;
    Slice::Slice((Slice *)in_stack_fffffffffffffef8);
LAB_018a5433:
    uVar2 = ReadPhysicalRecord(in_RDX,(Slice *)CONCAT17(bVar6,in_stack_ffffffffffffff80));
    lVar5 = *(long *)(in_RDI + 0x40);
    sVar3 = Slice::size((Slice *)in_stack_fffffffffffffef8);
    sVar4 = Slice::size((Slice *)in_stack_fffffffffffffef8);
    lVar5 = ((lVar5 - sVar3) + -7) - sVar4;
    if ((*(byte *)(in_RDI + 0x50) & 1) != 0) goto code_r0x018a549c;
    goto code_r0x018a54dd;
  }
  local_59 = false;
LAB_018a584d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_59;
code_r0x018a549c:
  if (uVar2 == 3) goto LAB_018a5433;
  if (uVar2 == 4) {
    *(undefined1 *)(in_RDI + 0x50) = 0;
    goto LAB_018a5433;
  }
  *(undefined1 *)(in_RDI + 0x50) = 0;
code_r0x018a54dd:
  switch(uVar2) {
  case 1:
    if (((bVar6 & 1) != 0) &&
       (bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty(in_stack_fffffffffffffef8), !bVar1)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                (in_stack_fffffffffffffef8);
      ReportCorruption(in_stack_ffffffffffffff30,(uint64_t)in_stack_ffffffffffffff28,
                       in_stack_ffffffffffffff20);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
              (in_stack_fffffffffffffef8);
    *in_RSI = local_48;
    in_RSI[1] = local_40;
    *(long *)(in_RDI + 0x38) = lVar5;
    local_59 = true;
    break;
  case 2:
    if (((bVar6 & 1) != 0) &&
       (bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty(in_stack_fffffffffffffef8), !bVar1)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                (in_stack_fffffffffffffef8);
      ReportCorruption(in_stack_ffffffffffffff30,(uint64_t)in_stack_ffffffffffffff28,
                       in_stack_ffffffffffffff20);
    }
    Slice::data((Slice *)in_stack_fffffffffffffef8);
    Slice::size((Slice *)in_stack_fffffffffffffef8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
               (size_type)in_stack_ffffffffffffff08);
    bVar6 = 1;
    local_88 = lVar5;
    goto LAB_018a5433;
  case 3:
    if ((bVar6 & 1) == 0) {
      Slice::size((Slice *)in_stack_fffffffffffffef8);
      ReportCorruption(in_stack_ffffffffffffff30,(uint64_t)in_stack_ffffffffffffff28,
                       in_stack_ffffffffffffff20);
    }
    else {
      pRVar7 = in_RDX;
      in_stack_ffffffffffffff30 = (Reader *)Slice::data((Slice *)in_stack_fffffffffffffef8);
      Slice::size((Slice *)in_stack_fffffffffffffef8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                 (size_type)in_stack_ffffffffffffff08);
      in_stack_ffffffffffffff28 = in_RDX;
      in_RDX = pRVar7;
    }
    goto LAB_018a5433;
  case 4:
    if ((bVar6 & 1) != 0) {
      Slice::data((Slice *)in_stack_fffffffffffffef8);
      Slice::size((Slice *)in_stack_fffffffffffffef8);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDX,
                 in_stack_ffffffffffffff10,(size_type)in_stack_ffffffffffffff08);
      Slice::Slice(in_stack_ffffffffffffff08,
                   (string *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
      *in_RSI = local_58;
      in_RSI[1] = local_50;
      *(long *)(in_RDI + 0x38) = local_88;
      local_59 = true;
      break;
    }
    Slice::size((Slice *)in_stack_fffffffffffffef8);
    ReportCorruption(in_stack_ffffffffffffff30,(uint64_t)in_stack_ffffffffffffff28,
                     in_stack_ffffffffffffff20);
    goto LAB_018a5433;
  case 5:
    if ((bVar6 & 1) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                (in_stack_fffffffffffffef8);
    }
    local_59 = false;
    break;
  case 6:
    if ((bVar6 & 1) != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                (in_stack_fffffffffffffef8);
      ReportCorruption(in_stack_ffffffffffffff30,(uint64_t)in_stack_ffffffffffffff28,
                       in_stack_ffffffffffffff20);
      bVar6 = 0;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
                (in_stack_fffffffffffffef8);
    }
    goto LAB_018a5433;
  default:
    snprintf(local_38,0x28,"unknown record type %u",(ulong)uVar2);
    in_stack_ffffffffffffff10 = (char *)Slice::size((Slice *)in_stack_fffffffffffffef8);
    if ((bVar6 & 1) == 0) {
      in_stack_ffffffffffffff08 = (Slice *)0x0;
    }
    else {
      in_stack_ffffffffffffff08 =
           (Slice *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::size(in_stack_fffffffffffffef8);
    }
    ReportCorruption(in_stack_ffffffffffffff30,(uint64_t)in_stack_ffffffffffffff28,
                     in_stack_ffffffffffffff20);
    bVar6 = 0;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
              (in_stack_fffffffffffffef8);
    goto LAB_018a5433;
  }
  goto LAB_018a584d;
}

Assistant:

bool Reader::ReadRecord(Slice* record, std::string* scratch) {
  if (last_record_offset_ < initial_offset_) {
    if (!SkipToInitialBlock()) {
      return false;
    }
  }

  scratch->clear();
  record->clear();
  bool in_fragmented_record = false;
  // Record offset of the logical record that we're reading
  // 0 is a dummy value to make compilers happy
  uint64_t prospective_record_offset = 0;

  Slice fragment;
  while (true) {
    const unsigned int record_type = ReadPhysicalRecord(&fragment);

    // ReadPhysicalRecord may have only had an empty trailer remaining in its
    // internal buffer. Calculate the offset of the next physical record now
    // that it has returned, properly accounting for its header size.
    uint64_t physical_record_offset =
        end_of_buffer_offset_ - buffer_.size() - kHeaderSize - fragment.size();

    if (resyncing_) {
      if (record_type == kMiddleType) {
        continue;
      } else if (record_type == kLastType) {
        resyncing_ = false;
        continue;
      } else {
        resyncing_ = false;
      }
    }

    switch (record_type) {
      case kFullType:
        if (in_fragmented_record) {
          // Handle bug in earlier versions of log::Writer where
          // it could emit an empty kFirstType record at the tail end
          // of a block followed by a kFullType or kFirstType record
          // at the beginning of the next block.
          if (!scratch->empty()) {
            ReportCorruption(scratch->size(), "partial record without end(1)");
          }
        }
        prospective_record_offset = physical_record_offset;
        scratch->clear();
        *record = fragment;
        last_record_offset_ = prospective_record_offset;
        return true;

      case kFirstType:
        if (in_fragmented_record) {
          // Handle bug in earlier versions of log::Writer where
          // it could emit an empty kFirstType record at the tail end
          // of a block followed by a kFullType or kFirstType record
          // at the beginning of the next block.
          if (!scratch->empty()) {
            ReportCorruption(scratch->size(), "partial record without end(2)");
          }
        }
        prospective_record_offset = physical_record_offset;
        scratch->assign(fragment.data(), fragment.size());
        in_fragmented_record = true;
        break;

      case kMiddleType:
        if (!in_fragmented_record) {
          ReportCorruption(fragment.size(),
                           "missing start of fragmented record(1)");
        } else {
          scratch->append(fragment.data(), fragment.size());
        }
        break;

      case kLastType:
        if (!in_fragmented_record) {
          ReportCorruption(fragment.size(),
                           "missing start of fragmented record(2)");
        } else {
          scratch->append(fragment.data(), fragment.size());
          *record = Slice(*scratch);
          last_record_offset_ = prospective_record_offset;
          return true;
        }
        break;

      case kEof:
        if (in_fragmented_record) {
          // This can be caused by the writer dying immediately after
          // writing a physical record but before completing the next; don't
          // treat it as a corruption, just ignore the entire logical record.
          scratch->clear();
        }
        return false;

      case kBadRecord:
        if (in_fragmented_record) {
          ReportCorruption(scratch->size(), "error in middle of record");
          in_fragmented_record = false;
          scratch->clear();
        }
        break;

      default: {
        char buf[40];
        snprintf(buf, sizeof(buf), "unknown record type %u", record_type);
        ReportCorruption(
            (fragment.size() + (in_fragmented_record ? scratch->size() : 0)),
            buf);
        in_fragmented_record = false;
        scratch->clear();
        break;
      }
    }
  }
  return false;
}